

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O3

void gflags::anon_unknown_5::TestFlagString
               (string *flags,string *expected_string,bool expected_bool,int32 expected_int32,
               double expected_double)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FlagSaver FStack_88;
  string sStack_80;
  string sStack_60;
  ulong uStack_40;
  string *psStack_38;
  string *psStack_30;
  double local_28;
  
  psStack_30 = (string *)0x135d20;
  local_28 = expected_double;
  pcVar3 = GetArgv0();
  psStack_30 = (string *)0x135d30;
  bVar1 = ReadFlagsFromString(flags,pcVar3,true);
  if (bVar1) {
    __n = expected_string->_M_string_length;
    if (__n != fLS::FLAGS_test_string_abi_cxx11_[1]) {
LAB_00135da2:
      psStack_30 = (string *)0x135da7;
      _GLOBAL__N_1::TestFlagString();
      goto LAB_00135da7;
    }
    if (__n != 0) {
      psStack_30 = (string *)0x135d55;
      iVar2 = bcmp((expected_string->_M_dataplus)._M_p,(void *)*fLS::FLAGS_test_string_abi_cxx11_,
                   __n);
      if (iVar2 != 0) goto LAB_00135da2;
    }
    if ((bool)fLB::FLAGS_test_bool != expected_bool) goto LAB_00135dac;
    if (fLI::FLAGS_test_int32 == expected_int32) {
      if ((fLD::FLAGS_test_double + -0.001 <= local_28) &&
         (local_28 <= fLD::FLAGS_test_double + 0.001)) {
        return;
      }
      goto LAB_00135db6;
    }
  }
  else {
LAB_00135da7:
    psStack_30 = (string *)0x135dac;
    _GLOBAL__N_1::TestFlagString();
LAB_00135dac:
    psStack_30 = (string *)0x135db1;
    _GLOBAL__N_1::TestFlagString();
  }
  psStack_30 = (string *)0x135db6;
  _GLOBAL__N_1::TestFlagString();
LAB_00135db6:
  psStack_30 = (string *)0x135dbb;
  _GLOBAL__N_1::TestFlagString();
  uStack_40 = (ulong)(uint)expected_int32;
  psStack_38 = expected_string;
  psStack_30 = flags;
  FlagSaver::FlagSaver(&FStack_88);
  fprintf(_stderr,"Running test %s/%s\n","FlagFileTest","FilenamesOurfileLast");
  std::__cxx11::string::_M_replace
            ((ulong)fLS::FLAGS_test_string_abi_cxx11_,0,(char *)fLS::FLAGS_test_string_abi_cxx11_[1]
             ,0x14817b);
  fLB::FLAGS_test_bool = 0;
  fLI::FLAGS_test_int32 = 0xffffffff;
  fLD::FLAGS_test_double = -1.0;
  sStack_80._M_dataplus._M_p = (pointer)&sStack_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sStack_80,
             "-test_string=continued\n# some comments are in order\n# some\n  # comments\n#are\n                  #trickier\n# than others\nnot_our_filename\n-test_bool=true\n     -test_int32=1\ngflags_unittest\n-test_double=1000.0\n"
             ,"");
  sStack_60.field_2._M_allocated_capacity = 0x65756e69746e6f63;
  sStack_60.field_2._8_2_ = 100;
  sStack_60._M_string_length = 9;
  sStack_60._M_dataplus._M_p = (pointer)&sStack_60.field_2;
  TestFlagString(&sStack_80,&sStack_60,false,-1,1000.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_60._M_dataplus._M_p != &sStack_60.field_2) {
    operator_delete(sStack_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_80._M_dataplus._M_p != &sStack_80.field_2) {
    operator_delete(sStack_80._M_dataplus._M_p);
  }
  FlagSaver::~FlagSaver(&FStack_88);
  return;
}

Assistant:

void TestFlagString(const string& flags,
                    const string& expected_string,
                    bool expected_bool,
                    int32 expected_int32,
                    double expected_double) {
  EXPECT_TRUE(ReadFlagsFromString(flags,
                                  GetArgv0(),
                                  // errors are fatal
                                  true));

  EXPECT_EQ(expected_string, FLAGS_test_string);
  EXPECT_EQ(expected_bool, FLAGS_test_bool);
  EXPECT_EQ(expected_int32, FLAGS_test_int32);
  EXPECT_DOUBLE_EQ(expected_double, FLAGS_test_double);
}